

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

ReferenceCounterValueType __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::Release
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this)

{
  ReferenceCounterValueType RVar1;
  char (*in_RCX) [26];
  RefCountersImpl *this_00;
  string sStack_30;
  
  this_00 = (this->super_ObjectBase<Diligent::IRenderDeviceGL>).
            super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters;
  if (this_00 == (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              (&sStack_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    DebugAssertionFailed
              (sStack_30._M_dataplus._M_p,"Release",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x229);
    std::__cxx11::string::~string((string *)&sStack_30);
    this_00 = (this->super_ObjectBase<Diligent::IRenderDeviceGL>).
              super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters;
  }
  RVar1 = RefCountersImpl::ReleaseStrongRef(this_00);
  return RVar1;
}

Assistant:

Release() override final
    {
        return TObjectBase::Release();
    }